

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

bool wallet::CWallet::AttachChain
               (shared_ptr<wallet::CWallet> *walletInstance,Chain *chain,bool rescan_required,
               bilingual_str *error,vector<bilingual_str,_std::allocator<bilingual_str>_> *warnings)

{
  uint uVar1;
  atomic<bool> *paVar2;
  uint256 *puVar3;
  pointer *ppuVar4;
  __int_type_conflict2 _Var5;
  Chain *pCVar6;
  _Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_> _Var7;
  _Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_> _Var8;
  CWallet *pCVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  base_blob<256U> *pbVar15;
  pointer puVar16;
  pointer puVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  uint extraout_var;
  uint extraout_var_00;
  uint extraout_var_01;
  element_type *peVar21;
  ulong uVar22;
  char *pcVar23;
  uint uVar24;
  long in_FS_OFFSET;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  uint local_130;
  int rescan_height;
  Notifications *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock60;
  undefined1 local_108 [32];
  CBlockLocator locator;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  CBlockLocator locator_1;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined1 local_68 [16];
  long *local_58;
  long local_50;
  long local_48 [2];
  long local_38;
  
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish =
       locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock60.super_unique_lock._M_device =
       &(((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
        ->cs_wallet).super_recursive_mutex;
  criticalblock60.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock60.super_unique_lock);
  peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  pCVar6 = peVar21->m_chain;
  uVar22 = (ulong)pCVar6 & 0xffffffffffffff00;
  if (pCVar6 != chain && pCVar6 != (Chain *)0x0) {
    __assert_fail("!walletInstance->m_chain || walletInstance->m_chain == &chain",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0xca8,
                  "static bool wallet::CWallet::AttachChain(const std::shared_ptr<CWallet> &, interfaces::Chain &, const bool, bilingual_str &, std::vector<bilingual_str> &)"
                 );
  }
  peVar21->m_chain = chain;
  ppuVar4 = &locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppuVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&locator_1,"-walletcrosschain","");
  bVar18 = ArgsManager::GetBoolArg(&gArgs,(string *)&locator_1,false);
  if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)ppuVar4) {
    operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if (bVar18) {
LAB_00c1a663:
    LOCK();
    paVar2 = &((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->m_attaching_chain;
    _Var5 = (paVar2->_M_base)._M_i;
    (paVar2->_M_base)._M_i = true;
    pcVar23 = (char *)CONCAT71((int7)(uVar22 >> 8),_Var5);
    UNLOCK();
    peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    pCVar6 = peVar21->m_chain;
    if (pCVar6 == (Chain *)0x0) {
      __assert_fail("m_chain",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                    ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
    }
    local_128 = &peVar21->super_Notifications;
    local_120 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar23 = &__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_120->_M_use_count = local_120->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_120->_M_use_count = local_120->_M_use_count + 1;
      }
    }
    (*pCVar6->_vptr_Chain[0x29])(&locator_1,pCVar6,&local_128,pcVar23);
    peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    puVar16 = locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start;
    puVar17 = locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish;
    auVar10._8_8_ = 0;
    auVar10._0_8_ =
         locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._0_16_ = auVar10 << 0x40;
    _Var8.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl =
         (peVar21->m_chain_notifications_handler)._M_t.
         super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
         super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
         super__Head_base<0UL,_interfaces::Handler_*,_false>;
    (peVar21->m_chain_notifications_handler)._M_t.
    super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
    super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
    super__Head_base<0UL,_interfaces::Handler_*,_false> =
         (_Head_base<0UL,_interfaces::Handler_*,_false>)puVar16;
    if (_Var8.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl != (Handler *)0x0) {
      (**(code **)(*(long *)_Var8.super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl +
                  8))();
      puVar17 = locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)((locator_1.vHave.
                                super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                              _M_elems + 8))();
        puVar17 = locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
    }
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar17;
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
         super__Vector_impl_data._M_finish;
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._0_16_ = auVar12 << 0x40;
    if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
    }
    rescan_height = 0;
    if (!rescan_required) {
      _Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
           (((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->m_database)._M_t.
           super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
           .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
      if (_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
          (WalletDatabase *)0x0) goto LAB_00c1af0f;
      (**(code **)(*(long *)_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>.
                            _M_head_impl + 0x70))
                (&locator,_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,
                 1);
      locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = uStack_90;
      stack0xffffffffffffff68 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )(auVar13 << 0x40);
      bVar18 = WalletBatch::ReadBestBlock((WalletBatch *)&locator,&locator_1);
      if ((bVar18) &&
         (iVar19 = (*chain->_vptr_Chain[7])(chain,&locator_1), (extraout_var_00 & 1) != 0)) {
        rescan_height = iVar19;
      }
      if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)((locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start)->super_base_blob<256U>).
                              m_data._M_elems + 0x28))();
      }
    }
    uVar20 = (*chain->_vptr_Chain[2])(chain);
    if ((extraout_var_01 & 1) == 0) {
      peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      pbVar15 = &(peVar21->m_last_block_processed).super_base_blob<256U>;
      (pbVar15->m_data)._M_elems[0x10] = '\0';
      (pbVar15->m_data)._M_elems[0x11] = '\0';
      (pbVar15->m_data)._M_elems[0x12] = '\0';
      (pbVar15->m_data)._M_elems[0x13] = '\0';
      (pbVar15->m_data)._M_elems[0x14] = '\0';
      (pbVar15->m_data)._M_elems[0x15] = '\0';
      (pbVar15->m_data)._M_elems[0x16] = '\0';
      (pbVar15->m_data)._M_elems[0x17] = '\0';
      (pbVar15->m_data)._M_elems[0x18] = '\0';
      (pbVar15->m_data)._M_elems[0x19] = '\0';
      (pbVar15->m_data)._M_elems[0x1a] = '\0';
      (pbVar15->m_data)._M_elems[0x1b] = '\0';
      (pbVar15->m_data)._M_elems[0x1c] = '\0';
      (pbVar15->m_data)._M_elems[0x1d] = '\0';
      (pbVar15->m_data)._M_elems[0x1e] = '\0';
      (pbVar15->m_data)._M_elems[0x1f] = '\0';
      puVar3 = &peVar21->m_last_block_processed;
      (puVar3->super_base_blob<256U>).m_data._M_elems[0] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[1] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[2] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[3] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[4] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[5] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[6] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[7] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[8] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[9] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[10] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
      (puVar3->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
      peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      peVar21->m_last_block_processed_height = -1;
    }
    else {
      (*chain->_vptr_Chain[3])(&locator_1,chain,uVar20);
      peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      *(pointer *)((peVar21->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10) =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      *(undefined8 *)
       ((peVar21->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_90;
      *(pointer *)(peVar21->m_last_block_processed).super_base_blob<256U>.m_data._M_elems =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(pointer *)((peVar21->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8) =
           locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
      peVar21 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      peVar21->m_last_block_processed_height = uVar20;
      if (rescan_height != uVar20) {
        local_68 = (undefined1  [16])0x0;
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    )0x0;
        local_88 = (undefined1  [16])0x0;
        stack0xffffffffffffff68 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = &rescan_height;
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._0_16_ = auVar14 << 0x40;
        (*chain->_vptr_Chain[0xb])
                  (chain,(peVar21->m_birth_time).super___atomic_base<long>._M_i + -0x1c20,
                   (ulong)(uint)rescan_height);
        if (local_68[8] == '\0') {
          rescan_height = uVar20;
        }
        iVar19 = (*chain->_vptr_Chain[0x21])(chain);
        if ((char)iVar19 == '\0') {
          iVar19 = (*chain->_vptr_Chain[0x35])(chain);
          if ((char)iVar19 != '\0') goto LAB_00c1a8c4;
        }
        else {
LAB_00c1a8c4:
          uVar24 = uVar20;
          local_130 = uVar20;
          if (0 < (int)uVar20) {
            do {
              uVar1 = uVar24 - 1;
              local_130 = uVar24;
              iVar19 = (*chain->_vptr_Chain[4])(chain,(ulong)uVar1);
              if (((byte)iVar19 & uVar24 != rescan_height) == 0) break;
              bVar18 = 1 < uVar24;
              uVar24 = uVar1;
              local_130 = uVar1;
            } while (bVar18);
          }
          if (rescan_height != uVar24) {
            iVar19 = (*chain->_vptr_Chain[0x21])(chain);
            if ((char)iVar19 == '\0') {
              locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&locator,
                         "Error loading wallet. Wallet requires blocks to be downloaded, and software does not currently support loading wallets while blocks are being downloaded out of order when using assumeutxo snapshots. Wallet should be able to load successfully after node sync reaches height %s"
                         ,"");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_c8._0_8_ = &local_b8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_c8,
                           "Error loading wallet. Wallet requires blocks to be downloaded, and software does not currently support loading wallets while blocks are being downloaded out of order when using assumeutxo snapshots. Wallet should be able to load successfully after node sync reaches height %s"
                           ,"");
              }
              else {
                local_108._0_8_ =
                     "Error loading wallet. Wallet requires blocks to be downloaded, and software does not currently support loading wallets while blocks are being downloaded out of order when using assumeutxo snapshots. Wallet should be able to load successfully after node sync reaches height %s"
                ;
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_c8,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_108);
              }
              tinyformat::format<int>
                        ((bilingual_str *)&locator_1,(bilingual_str *)&locator,(int *)&local_130);
            }
            else {
              locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)ppuVar4;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&locator_1,
                         "Prune: last wallet synchronisation goes beyond pruned data. You need to -reindex (download the whole blockchain again in case of pruned node)"
                         ,"");
              if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0
                 ) {
                local_88._0_8_ = &local_78;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_88,
                           "Prune: last wallet synchronisation goes beyond pruned data. You need to -reindex (download the whole blockchain again in case of pruned node)"
                           ,"");
              }
              else {
                locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)
                     "Prune: last wallet synchronisation goes beyond pruned data. You need to -reindex (download the whole blockchain again in case of pruned node)"
                ;
                (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&locator);
              }
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&error->original,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &locator_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&error->translated,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._0_8_ != &local_78) {
              operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
            }
            if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)ppuVar4) {
              operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)(((locator_1.vHave.
                                        super__Vector_base<uint256,_std::allocator<uint256>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                      super_base_blob<256U>).m_data._M_elems + 1));
            }
            if ((char)iVar19 == '\0') {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._0_8_ != &local_b8) {
                operator_delete((void *)local_c8._0_8_,local_b8._M_allocated_capacity + 1);
              }
              if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  (pointer)&locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage) {
                operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (ulong)(((locator.vHave.
                                          super__Vector_base<uint256,_std::allocator<uint256>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super_base_blob<256U>).m_data._M_elems + 1));
              }
            }
            goto LAB_00c1abee;
          }
        }
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&locator_1,anon_var_dwarf_4896446,anon_var_dwarf_4896446 + 0xd);
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_88._0_8_ = &local_78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,anon_var_dwarf_4896446,anon_var_dwarf_4896446 + 0xd);
        }
        else {
          locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_4896446;
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&locator);
        }
        (*chain->_vptr_Chain[0x25])
                  (chain,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._0_8_ != &local_78) {
          operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
        }
        if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (ulong)(((locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage)->
                                  super_base_blob<256U>).m_data._M_elems + 1));
        }
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar20 - rescan_height;
        WalletLogPrintf<int,int>
                  ((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr,(ConstevalFormatString<2U>)0x10e7c08,(int *)&locator_1,&rescan_height);
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish._0_1_ = 0;
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(walletInstance->
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        stack0xffffffffffffff28 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )0x0;
        local_c8 = (undefined1  [16])0x0;
        bVar18 = WalletRescanReserver::reserve((WalletRescanReserver *)&locator,false);
        if (bVar18) {
          pCVar9 = (walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr;
          (*chain->_vptr_Chain[3])(local_108,chain,(ulong)(uint)rescan_height);
          ScanForWalletTransactions
                    ((ScanResult *)&locator_1,pCVar9,(uint256 *)local_108,rescan_height,
                     (optional<int>)0x0,(WalletRescanReserver *)&locator,true,true);
          if ((int)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_start == 0) {
            WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)&locator);
            LOCK();
            (((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->m_attaching_chain)._M_base._M_i = false;
            UNLOCK();
            pCVar9 = (walletInstance->
                     super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            (*chain->_vptr_Chain[5])(&locator_1);
            chainStateFlushed(pCVar9,NORMAL,&locator_1);
            if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            _Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
                 (((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->m_database)._M_t.
                 super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                 .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
            if (_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
                (WalletDatabase *)0x0) {
LAB_00c1af0f:
              __assert_fail("static_cast<bool>(m_database)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                            ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
            }
            (**(code **)(*(long *)_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>.
                                  _M_head_impl + 0x50))();
            peVar21 = (walletInstance->
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            goto LAB_00c1aad6;
          }
        }
        locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&locator_1,"Failed to rescan the wallet during initialization","");
        if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
          local_88._0_8_ = &local_78;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_88,"Failed to rescan the wallet during initialization","");
        }
        else {
          local_108._0_8_ = "Failed to rescan the wallet during initialization";
          (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)local_108);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->original,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locator_1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&error->translated,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._0_8_ != &local_78) {
          operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
        }
        if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pointer)&locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (ulong)(((locator_1.vHave.
                                    super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage)->
                                  super_base_blob<256U>).m_data._M_elems + 1));
        }
        WalletRescanReserver::~WalletRescanReserver((WalletRescanReserver *)&locator);
        goto LAB_00c1abee;
      }
    }
LAB_00c1aad6:
    LOCK();
    (peVar21->m_attaching_chain)._M_base._M_i = false;
    UNLOCK();
    bVar18 = true;
  }
  else {
    _Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl =
         (((walletInstance->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->m_database)._M_t.
         super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
         ._M_t.
         super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
         .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>;
    if (_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl ==
        (WalletDatabase *)0x0) goto LAB_00c1af0f;
    (**(code **)(*(long *)_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl
                + 0x70))
              (local_108,_Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl,1
              );
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uStack_d0;
    stack0xffffffffffffff28 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )(auVar11 << 0x40);
    local_108._8_8_ = _Var7.super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
    bVar18 = WalletBatch::ReadBestBlock((WalletBatch *)local_108,&locator);
    if (!bVar18) goto LAB_00c1a63c;
    if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_00c1a641:
      if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((DatabaseBatch *)local_108._0_8_ != (DatabaseBatch *)0x0) {
        (*(*(_func_int ***)local_108._0_8_)[5])();
      }
      goto LAB_00c1a663;
    }
    (*chain->_vptr_Chain[2])(chain);
    if ((extraout_var & 1) == 0) {
LAB_00c1a63c:
      goto LAB_00c1a641;
    }
    (*chain->_vptr_Chain[3])(&locator_1,chain,0);
    auVar25[0] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0] ==
                  (uchar)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_start);
    auVar25[1] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[1] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._1_1_);
    auVar25[2] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[2] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._2_1_);
    auVar25[3] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[3] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._3_1_);
    auVar25[4] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[4] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._4_1_);
    auVar25[5] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[5] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._5_1_);
    auVar25[6] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[6] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._6_1_);
    auVar25[7] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[7] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_start._7_1_);
    auVar25[8] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[8] ==
                  (uchar)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
    auVar25[9] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[9] ==
                  locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish._1_1_);
    auVar25[10] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[10]
                   == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish._2_1_);
    auVar25[0xb] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xb] == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish._3_1_);
    auVar25[0xc] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xc] == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_1_);
    auVar25[0xd] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xd] == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish._5_1_);
    auVar25[0xe] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xe] == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish._6_1_);
    auVar25[0xf] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0xf] == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_finish._7_1_);
    auVar26[0] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x10]
                  == (uchar)locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    auVar26[1] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x11]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._1_1_);
    auVar26[2] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x12]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._2_1_);
    auVar26[3] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x13]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._3_1_);
    auVar26[4] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x14]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_1_);
    auVar26[5] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x15]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._5_1_);
    auVar26[6] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x16]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._6_1_);
    auVar26[7] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x17]
                  == locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._7_1_);
    auVar26[8] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x18]
                  == locator_1._24_1_);
    auVar26[9] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems[0x19]
                  == locator_1._25_1_);
    auVar26[10] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                    [0x1a] == locator_1._26_1_);
    auVar26[0xb] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1b] == locator_1._27_1_);
    auVar26[0xc] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1c] == locator_1._28_1_);
    auVar26[0xd] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1d] == locator_1._29_1_);
    auVar26[0xe] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1e] == locator_1._30_1_);
    auVar26[0xf] = -(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems
                     [0x1f] == locator_1._31_1_);
    auVar25 = auVar25 & auVar26;
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff) goto LAB_00c1a63c;
    local_58 = local_48;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "Wallet files should not be reused across chains. Restart bitcoind with -walletcrosschain to override."
               ,"");
    locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)ppuVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&locator_1,local_58,local_50 + (long)local_58);
    local_88._0_8_ = &local_78;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,local_58,local_50 + (long)local_58)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->original,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locator_1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&error->translated,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._0_8_ != &local_78) {
      operator_delete((void *)local_88._0_8_,local_78._M_allocated_capacity + 1);
    }
    if (locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppuVar4) {
      operator_delete(locator_1.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)(((locator_1.vHave.
                                super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage)->super_base_blob<256U>).
                              m_data._M_elems + 1));
    }
    if (local_58 != local_48) {
      operator_delete(local_58,local_48[0] + 1);
    }
    if (locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)locator.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((DatabaseBatch *)local_108._0_8_ != (DatabaseBatch *)0x0) {
      (*(*(_func_int ***)local_108._0_8_)[5])();
    }
LAB_00c1abee:
    bVar18 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock60.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar18;
}

Assistant:

bool CWallet::AttachChain(const std::shared_ptr<CWallet>& walletInstance, interfaces::Chain& chain, const bool rescan_required, bilingual_str& error, std::vector<bilingual_str>& warnings)
{
    LOCK(walletInstance->cs_wallet);
    // allow setting the chain if it hasn't been set already but prevent changing it
    assert(!walletInstance->m_chain || walletInstance->m_chain == &chain);
    walletInstance->m_chain = &chain;

    // Unless allowed, ensure wallet files are not reused across chains:
    if (!gArgs.GetBoolArg("-walletcrosschain", DEFAULT_WALLETCROSSCHAIN)) {
        WalletBatch batch(walletInstance->GetDatabase());
        CBlockLocator locator;
        if (batch.ReadBestBlock(locator) && locator.vHave.size() > 0 && chain.getHeight()) {
            // Wallet is assumed to be from another chain, if genesis block in the active
            // chain differs from the genesis block known to the wallet.
            if (chain.getBlockHash(0) != locator.vHave.back()) {
                error = Untranslated("Wallet files should not be reused across chains. Restart bitcoind with -walletcrosschain to override.");
                return false;
            }
        }
    }

    // Register wallet with validationinterface. It's done before rescan to avoid
    // missing block connections between end of rescan and validation subscribing.
    // Because of wallet lock being hold, block connection notifications are going to
    // be pending on the validation-side until lock release. It's likely to have
    // block processing duplicata (if rescan block range overlaps with notification one)
    // but we guarantee at least than wallet state is correct after notifications delivery.
    // However, chainStateFlushed notifications are ignored until the rescan is finished
    // so that in case of a shutdown event, the rescan will be repeated at the next start.
    // This is temporary until rescan and notifications delivery are unified under same
    // interface.
    walletInstance->m_attaching_chain = true; //ignores chainStateFlushed notifications
    walletInstance->m_chain_notifications_handler = walletInstance->chain().handleNotifications(walletInstance);

    // If rescan_required = true, rescan_height remains equal to 0
    int rescan_height = 0;
    if (!rescan_required)
    {
        WalletBatch batch(walletInstance->GetDatabase());
        CBlockLocator locator;
        if (batch.ReadBestBlock(locator)) {
            if (const std::optional<int> fork_height = chain.findLocatorFork(locator)) {
                rescan_height = *fork_height;
            }
        }
    }

    const std::optional<int> tip_height = chain.getHeight();
    if (tip_height) {
        walletInstance->m_last_block_processed = chain.getBlockHash(*tip_height);
        walletInstance->m_last_block_processed_height = *tip_height;
    } else {
        walletInstance->m_last_block_processed.SetNull();
        walletInstance->m_last_block_processed_height = -1;
    }

    if (tip_height && *tip_height != rescan_height)
    {
        // No need to read and scan block if block was created before
        // our wallet birthday (as adjusted for block time variability)
        std::optional<int64_t> time_first_key = walletInstance->m_birth_time.load();
        if (time_first_key) {
            FoundBlock found = FoundBlock().height(rescan_height);
            chain.findFirstBlockWithTimeAndHeight(*time_first_key - TIMESTAMP_WINDOW, rescan_height, found);
            if (!found.found) {
                // We were unable to find a block that had a time more recent than our earliest timestamp
                // or a height higher than the wallet was synced to, indicating that the wallet is newer than the
                // current chain tip. Skip rescanning in this case.
                rescan_height = *tip_height;
            }
        }

        // Technically we could execute the code below in any case, but performing the
        // `while` loop below can make startup very slow, so only check blocks on disk
        // if necessary.
        if (chain.havePruned() || chain.hasAssumedValidChain()) {
            int block_height = *tip_height;
            while (block_height > 0 && chain.haveBlockOnDisk(block_height - 1) && rescan_height != block_height) {
                --block_height;
            }

            if (rescan_height != block_height) {
                // We can't rescan beyond blocks we don't have data for, stop and throw an error.
                // This might happen if a user uses an old wallet within a pruned node
                // or if they ran -disablewallet for a longer time, then decided to re-enable
                // Exit early and print an error.
                // It also may happen if an assumed-valid chain is in use and therefore not
                // all block data is available.
                // If a block is pruned after this check, we will load the wallet,
                // but fail the rescan with a generic error.

                error = chain.havePruned() ?
                     _("Prune: last wallet synchronisation goes beyond pruned data. You need to -reindex (download the whole blockchain again in case of pruned node)") :
                     strprintf(_(
                        "Error loading wallet. Wallet requires blocks to be downloaded, "
                        "and software does not currently support loading wallets while "
                        "blocks are being downloaded out of order when using assumeutxo "
                        "snapshots. Wallet should be able to load successfully after "
                        "node sync reaches height %s"), block_height);
                return false;
            }
        }

        chain.initMessage(_("Rescanning…").translated);
        walletInstance->WalletLogPrintf("Rescanning last %i blocks (from block %i)...\n", *tip_height - rescan_height, rescan_height);

        {
            WalletRescanReserver reserver(*walletInstance);
            if (!reserver.reserve() || (ScanResult::SUCCESS != walletInstance->ScanForWalletTransactions(chain.getBlockHash(rescan_height), rescan_height, /*max_height=*/{}, reserver, /*fUpdate=*/true, /*save_progress=*/true).status)) {
                error = _("Failed to rescan the wallet during initialization");
                return false;
            }
        }
        walletInstance->m_attaching_chain = false;
        walletInstance->chainStateFlushed(ChainstateRole::NORMAL, chain.getTipLocator());
        walletInstance->GetDatabase().IncrementUpdateCounter();
    }
    walletInstance->m_attaching_chain = false;

    return true;
}